

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineHuge.cpp
# Opt level: O2

void testDeepScanLineHuge(string *tempDir)

{
  ostream *poVar1;
  string *in_RCX;
  bool random_channel_data;
  bool random_channel_data_00;
  string fn;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\n\nTesting the DeepScanLineInput/OutputFile for huge scanlines:\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  random_reseed(1);
  std::operator+(&fn,tempDir,"imf_test_deep_scanline_huge.exr");
  anon_unknown.dwarf_efbae::readWriteTest(0,(int)&fn,random_channel_data,in_RCX);
  anon_unknown.dwarf_efbae::readWriteTest(1,(int)&fn,random_channel_data_00,in_RCX);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&fn);
  return;
}

Assistant:

void testDeepScanLineHuge (const std::string & tempDir)
{
    try
    {
        cout << "\n\nTesting the DeepScanLineInput/OutputFile for huge scanlines:\n" << endl;

        random_reseed(1);
        std::string fn = tempDir + "imf_test_deep_scanline_huge.exr";

        readWriteTest (10, 5 , false, fn);
        readWriteTest (10, 5 , true,  fn);
        cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}